

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

void __thiscall
duckdb::PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator>::Insert
          (PrimitiveDictionary<unsigned_int,_unsigned_int,_duckdb::ParquetCastOperator> *this,
          uint value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *ppVar3;
  uint local_14;
  
  if ((this->full == false) &&
     (local_14 = value, ppVar3 = Lookup(this,&local_14), ppVar3->index == 0xffffffff)) {
    if ((this->size + 1 <= this->maximum_size) &&
       (bVar2 = AddToTarget<unsigned_int,_0>(this,&local_14), bVar2)) {
      ppVar3->value = local_14;
      iVar1 = this->size;
      this->size = iVar1 + 1;
      ppVar3->index = (uint32_t)iVar1;
      return;
    }
    this->full = true;
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}